

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::GoniometricLight::GoniometricLight
          (GoniometricLight *this,Transform *renderFromLight,MediumInterface *mediumInterface,
          SpectrumHandle *I,Float scale,Image *im,RGBColorSpace *imageColorSpace,Allocator alloc)

{
  PiecewiseConstant2D *this_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  Allocator AVar4;
  size_t sVar5;
  long in_FS_OFFSET;
  Bounds2f domain_00;
  Bounds2f domain;
  Array2D<float> d;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  int va;
  float fStack_ac;
  
  LightBase::LightBase(&this->super_LightBase,DeltaPosition,renderFromLight,mediumInterface);
  local_e0.bits =
       (I->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum(&this->I,(SpectrumHandle *)&local_e0,alloc);
  this->scale = scale;
  Image::Image(&this->image,im);
  this->imageColorSpace = imageColorSpace;
  WrapMode2D::WrapMode2D(&this->wrapMode,Repeat,Clamp);
  this_00 = &this->distrib;
  PiecewiseConstant2D::PiecewiseConstant2D(this_00,alloc);
  va = 1;
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)(this->image).channelNames.nStored;
  if (d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x == 1) {
    va = 0;
    fStack_ac = 0.0;
    d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0x40c90fdb;
    d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0x40490fdb;
    Bounds2<float>::Bounds2(&domain,(Point2<float> *)&va,(Point2<float> *)&d);
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    local_c0 = std::
               _Function_handler<float_(pbrt::Point2<float>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:444:17)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<float_(pbrt::Point2<float>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:444:17)>
               ::_M_manager;
    AVar4.memoryResource = pstd::pmr::new_delete_resource();
    Image::GetSamplingDistribution
              (&d,&this->image,(function<float_(pbrt::Point2<float>)> *)&local_d8,&domain,AVar4);
    std::_Function_base::~_Function_base((_Function_base *)&local_d8);
    AVar4.memoryResource = pstd::pmr::new_delete_resource();
    domain_00.pMax.super_Tuple2<pbrt::Point2,_float> = domain.pMax.super_Tuple2<pbrt::Point2,_float>
    ;
    domain_00.pMin.super_Tuple2<pbrt::Point2,_float> = domain.pMin.super_Tuple2<pbrt::Point2,_float>
    ;
    PiecewiseConstant2D::PiecewiseConstant2D((PiecewiseConstant2D *)&va,&d,domain_00,AVar4);
    PiecewiseConstant2D::operator=(this_00,(PiecewiseConstant2D *)&va);
    PiecewiseConstant2D::~PiecewiseConstant2D((PiecewiseConstant2D *)&va);
    sVar1 = (this->image).p8.nStored;
    sVar2 = (this->image).p16.nStored;
    sVar3 = (this->image).p32.nStored;
    sVar5 = PiecewiseConstant2D::BytesUsed(this_00);
    *(long *)(in_FS_OFFSET + -0x220) =
         *(long *)(in_FS_OFFSET + -0x220) + sVar1 + sVar2 * 2 + sVar3 * 4 + sVar5;
    Array2D<float>::~Array2D(&d);
    return;
  }
  LogFatal<char_const(&)[2],char_const(&)[18],char_const(&)[2],int&,char_const(&)[18],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
             ,0x1b9,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x2cf26ec,
             (char (*) [18])"image.NChannels()",(char (*) [2])0x2cf26ec,&va,
             (char (*) [18])"image.NChannels()",(int *)&d);
}

Assistant:

GoniometricLight::GoniometricLight(const Transform &renderFromLight,
                                   const MediumInterface &mediumInterface,
                                   SpectrumHandle I, Float scale, Image im,
                                   const RGBColorSpace *imageColorSpace, Allocator alloc)
    : LightBase(LightType::DeltaPosition, renderFromLight, mediumInterface),
      I(I, alloc),
      scale(scale),
      image(std::move(im)),
      imageColorSpace(imageColorSpace),
      wrapMode(WrapMode::Repeat, WrapMode::Clamp),
      distrib(alloc) {
    CHECK_EQ(1, image.NChannels());
    // Compute sampling distribution for _GoniometricLight_
    Bounds2f domain(Point2f(0, 0), Point2f(2 * Pi, Pi));
    auto dpdA = [](const Point2f &p) { return std::sin(p.y); };
    Array2D<Float> d = image.GetSamplingDistribution(dpdA, domain);
    distrib = PiecewiseConstant2D(d, domain);

    imageBytes += image.BytesUsed() + distrib.BytesUsed();
}